

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O1

int32 get_rc_nssid(dict2pid_t *d2p,s3wid_t w,dict_t *dict)

{
  short sVar1;
  s3cipid_t *psVar2;
  xwdssid_t *pxVar3;
  long lVar4;
  
  lVar4 = (long)dict->word[w].pronlen;
  psVar2 = dict->word[w].ciphone;
  sVar1 = psVar2[lVar4 + -1];
  if (lVar4 == 1) {
    pxVar3 = d2p->lrssid[sVar1];
  }
  else {
    pxVar3 = d2p->rssid[sVar1] + psVar2[lVar4 + -2];
  }
  return pxVar3->n_ssid;
}

Assistant:

int32
get_rc_nssid(dict2pid_t * d2p, s3wid_t w, dict_t * dict)
{
    int32 pronlen;
    s3cipid_t b, lc;

    pronlen = dict->word[w].pronlen;
    b = dict->word[w].ciphone[pronlen - 1];

    if (pronlen == 1) {
        /* Is this true ?
           No known left context.  But all cimaps (for any l) are identical; pick one 
         */
        /*E_INFO("Single phone word\n"); */
        return (d2p->lrssid[b][0].n_ssid);
    }
    else {
        /*    E_INFO("Multiple phone word\n"); */
        lc = dict->word[w].ciphone[pronlen - 2];
        return (d2p->rssid[b][lc].n_ssid);
    }

}